

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_normal_attribute_encoder.cc
# Opt level: O0

bool __thiscall
draco::SequentialNormalAttributeEncoder::Init
          (SequentialNormalAttributeEncoder *this,PointCloudEncoder *encoder,int attribute_id)

{
  bool bVar1;
  uint8_t uVar2;
  int quantization_bits_00;
  PointAttribute *this_00;
  EncoderOptions *pEVar3;
  PointCloudEncoder *in_RSI;
  PointCloudEncoder *in_RDI;
  int quantization_bits;
  undefined8 in_stack_ffffffffffffff98;
  string *name;
  DracoOptions<int> *in_stack_ffffffffffffffa8;
  allocator<char> local_41;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  bool local_1;
  
  bVar1 = SequentialIntegerAttributeEncoder::Init
                    ((SequentialIntegerAttributeEncoder *)in_stack_ffffffffffffffa8,in_RDI,
                     (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  if (bVar1) {
    this_00 = SequentialAttributeEncoder::attribute((SequentialAttributeEncoder *)in_RDI);
    uVar2 = GeometryAttribute::num_components(&this_00->super_GeometryAttribute);
    if (uVar2 == '\x03') {
      pEVar3 = PointCloudEncoder::options(in_RSI);
      name = (string *)&local_41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      quantization_bits_00 =
           DracoOptions<int>::GetAttributeInt
                     (in_stack_ffffffffffffffa8,(AttributeKey *)in_RDI,name,
                      (int)((ulong)pEVar3 >> 0x20));
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
      std::allocator<char>::~allocator(&local_41);
      if (quantization_bits_00 < 1) {
        local_1 = false;
      }
      else {
        AttributeOctahedronTransform::SetParameters
                  ((AttributeOctahedronTransform *)
                   &(in_RDI->attributes_encoder_ids_order_).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_end_of_storage,quantization_bits_00);
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SequentialNormalAttributeEncoder::Init(PointCloudEncoder *encoder,
                                            int attribute_id) {
  if (!SequentialIntegerAttributeEncoder::Init(encoder, attribute_id)) {
    return false;
  }
  // Currently this encoder works only for 3-component normal vectors.
  if (attribute()->num_components() != 3) {
    return false;
  }

  // Initialize AttributeOctahedronTransform.
  const int quantization_bits = encoder->options()->GetAttributeInt(
      attribute_id, "quantization_bits", -1);
  if (quantization_bits < 1) {
    return false;
  }
  attribute_octahedron_transform_.SetParameters(quantization_bits);
  return true;
}